

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

ByteData *
cfd::core::WallyUtil::MulTweakPubkey
          (ByteData *__return_storage_ptr__,ByteData *pubkey,ByteData256 *tweak)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  Secp256k1 local_30;
  Secp256k1 secp256k1;
  secp256k1_context_struct *context;
  ByteData256 *tweak_local;
  ByteData *pubkey_local;
  
  secp256k1.secp256k1_context_ = wally_get_secp_context();
  Secp256k1::Secp256k1(&local_30,secp256k1.secp256k1_context_);
  ByteData256::GetBytes(&local_60,tweak);
  ByteData::ByteData(&local_48,&local_60);
  Secp256k1::MulTweakPubkeySecp256k1Ec(__return_storage_ptr__,&local_30,pubkey,&local_48);
  ByteData::~ByteData((ByteData *)0x3f98f6);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&pubkey->data_);
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::MulTweakPubkey(
    const ByteData& pubkey, const ByteData256& tweak) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.MulTweakPubkeySecp256k1Ec(
      pubkey, ByteData(tweak.GetBytes()));
}